

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<FuncInfo::SlotKey,_unsigned_short,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_FuncInfo::SlotKeyComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValue<FuncInfo::SlotKey>
          (BaseDictionary<FuncInfo::SlotKey,_unsigned_short,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_FuncInfo::SlotKeyComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,SlotKey *key,unsigned_short *value)

{
  Type piVar1;
  Type pSVar2;
  uint uVar3;
  Type this_00;
  uint uVar4;
  
  piVar1 = this->buckets;
  uVar3 = 0;
  if (piVar1 != (Type)0x0) {
    uVar3 = GetBucket((key->slot & 0xfU | *(uint *)&key->scope) * 2 + 1,this->bucketCount,
                      this->modFunctionIndex);
    uVar4 = piVar1[uVar3];
    uVar3 = 0;
    if (-1 < (int)uVar4) {
      pSVar2 = this->entries;
      uVar3 = 0;
      do {
        if ((pSVar2[uVar4].
             super_DefaultHashedEntry<FuncInfo::SlotKey,_unsigned_short,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .super_KeyValueEntry<FuncInfo::SlotKey,_unsigned_short>.
             super_ValueEntry<unsigned_short,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<FuncInfo::SlotKey,_unsigned_short>_>
             .super_KeyValueEntryDataLayout2<FuncInfo::SlotKey,_unsigned_short>.key.scope ==
             key->scope) &&
           (pSVar2[uVar4].
            super_DefaultHashedEntry<FuncInfo::SlotKey,_unsigned_short,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<FuncInfo::SlotKey,_unsigned_short>.
            super_ValueEntry<unsigned_short,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<FuncInfo::SlotKey,_unsigned_short>_>
            .super_KeyValueEntryDataLayout2<FuncInfo::SlotKey,_unsigned_short>.key.slot == key->slot
           )) {
          this_00 = this->stats;
          goto LAB_0082aa3a;
        }
        uVar3 = uVar3 + 1;
        uVar4 = pSVar2[uVar4].
                super_DefaultHashedEntry<FuncInfo::SlotKey,_unsigned_short,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<FuncInfo::SlotKey,_unsigned_short>.
                super_ValueEntry<unsigned_short,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<FuncInfo::SlotKey,_unsigned_short>_>
                .super_KeyValueEntryDataLayout2<FuncInfo::SlotKey,_unsigned_short>.next;
      } while (-1 < (int)uVar4);
    }
  }
  this_00 = this->stats;
  uVar4 = 0xffffffff;
LAB_0082aa3a:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar3);
  }
  if (-1 < (int)uVar4) {
    *value = this->entries[uVar4].
             super_DefaultHashedEntry<FuncInfo::SlotKey,_unsigned_short,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .super_KeyValueEntry<FuncInfo::SlotKey,_unsigned_short>.
             super_ValueEntry<unsigned_short,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<FuncInfo::SlotKey,_unsigned_short>_>
             .super_KeyValueEntryDataLayout2<FuncInfo::SlotKey,_unsigned_short>.value;
  }
  return -1 < (int)uVar4;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }